

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

void __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::~hash_map(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
            *this)

{
  uint uVar1;
  long lVar2;
  raw_node *prVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(this->m_values).m_size;
  prVar3 = (this->m_values).m_p;
  if (uVar4 == 0) {
    if (prVar3 != (raw_node *)0x0) {
      uVar4 = (ulong)(this->m_values).m_size;
      if (uVar4 != 0) {
        lVar2 = 0;
        do {
          if ((prVar3->m_bits[lVar2 + 0x1c] != '\0') &&
             (*(void **)(prVar3->m_bits + lVar2) != (void *)0x0)) {
            crnlib_free(*(void **)(prVar3->m_bits + lVar2));
          }
          lVar2 = lVar2 + 0x20;
        } while (uVar4 << 5 != lVar2);
        prVar3 = (this->m_values).m_p;
      }
      crnlib_free(prVar3);
    }
  }
  else {
    uVar1 = this->m_num_valid;
    lVar2 = 0;
    do {
      if (prVar3->m_bits[lVar2 + 0x1c] != '\0') {
        if (*(void **)(prVar3->m_bits + lVar2) != (void *)0x0) {
          crnlib_free(*(void **)(prVar3->m_bits + lVar2));
        }
        uVar1 = uVar1 - 1;
        if (uVar1 == 0) break;
      }
      lVar2 = lVar2 + 0x20;
    } while (uVar4 << 5 != lVar2);
    prVar3 = (this->m_values).m_p;
    if (prVar3 != (raw_node *)0x0) {
      crnlib_free(prVar3);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    this->m_num_valid = 0;
    this->m_grow_threshold = 0;
  }
  return;
}

Assistant:

inline ~hash_map()
        {
            clear();
        }